

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::java::ImmutableMapFieldGenerator::GenerateMessageMapGetters
          (ImmutableMapFieldGenerator *this,Printer *printer)

{
  flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *vars;
  FieldDescriptor *pFVar1;
  Context *pCVar2;
  pointer pcVar3;
  string_view begin_varname;
  string_view begin_varname_00;
  string_view begin_varname_01;
  string_view begin_varname_02;
  string_view begin_varname_03;
  string_view begin_varname_04;
  string_view text;
  string_view text_00;
  string_view text_01;
  string_view text_02;
  string_view text_03;
  string_view text_04;
  string_view end_varname;
  string_view end_varname_00;
  string_view end_varname_01;
  string_view end_varname_02;
  string_view end_varname_03;
  string_view end_varname_04;
  undefined1 local_170 [8];
  _Alloc_hider local_168;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_158;
  _Alloc_hider local_148;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_138;
  undefined2 local_128;
  undefined1 local_120 [8];
  _Alloc_hider local_118;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_108;
  _Alloc_hider local_f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e8;
  undefined2 local_d8;
  undefined1 local_d0 [8];
  _Alloc_hider local_c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b8;
  _Alloc_hider local_a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_98;
  undefined2 local_88;
  undefined1 local_80 [8];
  _Alloc_hider local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  _Alloc_hider local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  undefined2 local_38;
  
  vars = &this->variables_;
  text._M_str = 
  "$deprecation$public int ${$get$capitalized_name$Count$}$() {\n  return internalGet$capitalized_name$().ensureBuilderMap().size();\n}\n"
  ;
  text._M_len = 0x83;
  io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (printer,vars,text);
  begin_varname._M_str = "{";
  begin_varname._M_len = 1;
  end_varname._M_str = "}";
  end_varname._M_len = 1;
  io::Printer::Annotate<google::protobuf::FieldDescriptor>
            (printer,begin_varname,end_varname,this->descriptor_,
             (optional<google::protobuf::io::AnnotationCollector::Semantic>)0x0);
  pFVar1 = this->descriptor_;
  pCVar2 = this->context_;
  local_80[4] = (pCVar2->options_).opensource_runtime;
  local_80[5] = (pCVar2->options_).annotate_code;
  local_80[0] = (pCVar2->options_).generate_immutable_code;
  local_80[1] = (pCVar2->options_).generate_mutable_code;
  local_80[2] = (pCVar2->options_).generate_shared_code;
  local_80[3] = (pCVar2->options_).enforce_lite;
  pcVar3 = (pCVar2->options_).annotation_list_file._M_dataplus._M_p;
  local_78._M_p = (pointer)&local_68;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_78,pcVar3,
             pcVar3 + (pCVar2->options_).annotation_list_file._M_string_length);
  pcVar3 = (pCVar2->options_).output_list_file._M_dataplus._M_p;
  local_58._M_p = (pointer)&local_48;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_58,pcVar3,
             pcVar3 + (pCVar2->options_).output_list_file._M_string_length);
  local_38._0_1_ = (pCVar2->options_).strip_nonfunctional_codegen;
  local_38._1_1_ = (pCVar2->options_).jvm_dsl;
  WriteFieldDocComment(printer,pFVar1,(Options *)local_80,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_p != &local_48) {
    operator_delete(local_58._M_p,local_48._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_p != &local_68) {
    operator_delete(local_78._M_p,local_68._M_allocated_capacity + 1);
  }
  text_00._M_str =
       "@java.lang.Override\n$deprecation$public boolean ${$contains$capitalized_name$$}$(\n    $key_type$ key) {\n  $key_null_check$\n  return internalGet$capitalized_name$().ensureBuilderMap().containsKey(key);\n}\n"
  ;
  text_00._M_len = 0xcb;
  io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (printer,vars,text_00);
  begin_varname_00._M_str = "{";
  begin_varname_00._M_len = 1;
  end_varname_00._M_str = "}";
  end_varname_00._M_len = 1;
  io::Printer::Annotate<google::protobuf::FieldDescriptor>
            (printer,begin_varname_00,end_varname_00,this->descriptor_,
             (optional<google::protobuf::io::AnnotationCollector::Semantic>)0x0);
  if ((this->context_->options_).opensource_runtime == true) {
    text_01._M_str =
         "/**\n * Use {@link #get$capitalized_name$Map()} instead.\n */\n@java.lang.Override\n@java.lang.Deprecated\npublic java.util.Map<$type_parameters$> ${$get$capitalized_name$$}$() {\n  return get$capitalized_name$Map();\n}\n"
    ;
    text_01._M_len = 0xd5;
    io::Printer::
    Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
              (printer,vars,text_01);
    begin_varname_01._M_str = "{";
    begin_varname_01._M_len = 1;
    end_varname_01._M_str = "}";
    end_varname_01._M_len = 1;
    io::Printer::Annotate<google::protobuf::FieldDescriptor>
              (printer,begin_varname_01,end_varname_01,this->descriptor_,
               (optional<google::protobuf::io::AnnotationCollector::Semantic>)0x0);
  }
  pFVar1 = this->descriptor_;
  pCVar2 = this->context_;
  local_d0[4] = (pCVar2->options_).opensource_runtime;
  local_d0[5] = (pCVar2->options_).annotate_code;
  local_d0[0] = (pCVar2->options_).generate_immutable_code;
  local_d0[1] = (pCVar2->options_).generate_mutable_code;
  local_d0[2] = (pCVar2->options_).generate_shared_code;
  local_d0[3] = (pCVar2->options_).enforce_lite;
  pcVar3 = (pCVar2->options_).annotation_list_file._M_dataplus._M_p;
  local_c8._M_p = (pointer)&local_b8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_c8,pcVar3,
             pcVar3 + (pCVar2->options_).annotation_list_file._M_string_length);
  pcVar3 = (pCVar2->options_).output_list_file._M_dataplus._M_p;
  local_a8._M_p = (pointer)&local_98;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_a8,pcVar3,
             pcVar3 + (pCVar2->options_).output_list_file._M_string_length);
  local_88._0_1_ = (pCVar2->options_).strip_nonfunctional_codegen;
  local_88._1_1_ = (pCVar2->options_).jvm_dsl;
  WriteFieldDocComment(printer,pFVar1,(Options *)local_d0,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_p != &local_98) {
    operator_delete(local_a8._M_p,local_98._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_p != &local_b8) {
    operator_delete(local_c8._M_p,local_b8._M_allocated_capacity + 1);
  }
  text_02._M_str =
       "@java.lang.Override\n$deprecation$public java.util.Map<$type_parameters$> ${$get$capitalized_name$Map$}$() {\n  return internalGet$capitalized_name$().getImmutableMap();\n}\n"
  ;
  text_02._M_len = 0xaa;
  io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (printer,vars,text_02);
  begin_varname_02._M_str = "{";
  begin_varname_02._M_len = 1;
  end_varname_02._M_str = "}";
  end_varname_02._M_len = 1;
  io::Printer::Annotate<google::protobuf::FieldDescriptor>
            (printer,begin_varname_02,end_varname_02,this->descriptor_,
             (optional<google::protobuf::io::AnnotationCollector::Semantic>)0x0);
  pFVar1 = this->descriptor_;
  pCVar2 = this->context_;
  local_120[4] = (pCVar2->options_).opensource_runtime;
  local_120[5] = (pCVar2->options_).annotate_code;
  local_120[0] = (pCVar2->options_).generate_immutable_code;
  local_120[1] = (pCVar2->options_).generate_mutable_code;
  local_120[2] = (pCVar2->options_).generate_shared_code;
  local_120[3] = (pCVar2->options_).enforce_lite;
  pcVar3 = (pCVar2->options_).annotation_list_file._M_dataplus._M_p;
  local_118._M_p = (pointer)&local_108;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_118,pcVar3,
             pcVar3 + (pCVar2->options_).annotation_list_file._M_string_length);
  pcVar3 = (pCVar2->options_).output_list_file._M_dataplus._M_p;
  local_f8._M_p = (pointer)&local_e8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_f8,pcVar3,
             pcVar3 + (pCVar2->options_).output_list_file._M_string_length);
  local_d8._0_1_ = (pCVar2->options_).strip_nonfunctional_codegen;
  local_d8._1_1_ = (pCVar2->options_).jvm_dsl;
  WriteFieldDocComment(printer,pFVar1,(Options *)local_120,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_p != &local_e8) {
    operator_delete(local_f8._M_p,local_e8._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_p != &local_108) {
    operator_delete(local_118._M_p,local_108._M_allocated_capacity + 1);
  }
  text_03._M_str =
       "@java.lang.Override\n$deprecation$public $value_type_pass_through_nullness$ ${$get$capitalized_name$OrDefault$}$(\n    $key_type$ key,\n    $value_type_pass_through_nullness$ defaultValue) {\n  $key_null_check$\n  java.util.Map<$boxed_key_type$, $value_interface_type$> map = internalGetMutable$capitalized_name$().ensureBuilderMap();\n  return map.containsKey(key) ? $name$Converter.build(map.get(key)) : defaultValue;\n}\n"
  ;
  text_03._M_len = 0x1a0;
  io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (printer,vars,text_03);
  begin_varname_03._M_str = "{";
  begin_varname_03._M_len = 1;
  end_varname_03._M_str = "}";
  end_varname_03._M_len = 1;
  io::Printer::Annotate<google::protobuf::FieldDescriptor>
            (printer,begin_varname_03,end_varname_03,this->descriptor_,
             (optional<google::protobuf::io::AnnotationCollector::Semantic>)0x0);
  pFVar1 = this->descriptor_;
  pCVar2 = this->context_;
  local_170[4] = (pCVar2->options_).opensource_runtime;
  local_170[5] = (pCVar2->options_).annotate_code;
  local_170[0] = (pCVar2->options_).generate_immutable_code;
  local_170[1] = (pCVar2->options_).generate_mutable_code;
  local_170[2] = (pCVar2->options_).generate_shared_code;
  local_170[3] = (pCVar2->options_).enforce_lite;
  pcVar3 = (pCVar2->options_).annotation_list_file._M_dataplus._M_p;
  local_168._M_p = (pointer)&local_158;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_168,pcVar3,
             pcVar3 + (pCVar2->options_).annotation_list_file._M_string_length);
  pcVar3 = (pCVar2->options_).output_list_file._M_dataplus._M_p;
  local_148._M_p = (pointer)&local_138;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_148,pcVar3,
             pcVar3 + (pCVar2->options_).output_list_file._M_string_length);
  local_128._0_1_ = (pCVar2->options_).strip_nonfunctional_codegen;
  local_128._1_1_ = (pCVar2->options_).jvm_dsl;
  WriteFieldDocComment(printer,pFVar1,(Options *)local_170,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_148._M_p != &local_138) {
    operator_delete(local_148._M_p,local_138._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_168._M_p != &local_158) {
    operator_delete(local_168._M_p,local_158._M_allocated_capacity + 1);
  }
  text_04._M_str =
       "@java.lang.Override\n$deprecation$public $value_type$ ${$get$capitalized_name$OrThrow$}$(\n    $key_type$ key) {\n  $key_null_check$\n  java.util.Map<$boxed_key_type$, $value_interface_type$> map = internalGetMutable$capitalized_name$().ensureBuilderMap();\n  if (!map.containsKey(key)) {\n    throw new java.lang.IllegalArgumentException();\n  }\n  return $name$Converter.build(map.get(key));\n}\n"
  ;
  text_04._M_len = 0x184;
  io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (printer,vars,text_04);
  begin_varname_04._M_str = "{";
  begin_varname_04._M_len = 1;
  end_varname_04._M_str = "}";
  end_varname_04._M_len = 1;
  io::Printer::Annotate<google::protobuf::FieldDescriptor>
            (printer,begin_varname_04,end_varname_04,this->descriptor_,
             (optional<google::protobuf::io::AnnotationCollector::Semantic>)0x0);
  return;
}

Assistant:

void ImmutableMapFieldGenerator::GenerateMessageMapGetters(
    io::Printer* printer) const {
  printer->Print(
      variables_,
      "$deprecation$public int ${$get$capitalized_name$Count$}$() {\n"
      "  return internalGet$capitalized_name$().ensureBuilderMap().size();\n"
      "}\n");
  printer->Annotate("{", "}", descriptor_);

  WriteFieldDocComment(printer, descriptor_, context_->options());
  printer->Print(
      variables_,
      "@java.lang.Override\n"
      "$deprecation$public boolean ${$contains$capitalized_name$$}$(\n"
      "    $key_type$ key) {\n"
      "  $key_null_check$\n"
      "  return "
      "internalGet$capitalized_name$().ensureBuilderMap().containsKey(key);\n"
      "}\n");
  printer->Annotate("{", "}", descriptor_);
  if (context_->options().opensource_runtime) {
    printer->Print(variables_,
                   "/**\n"
                   " * Use {@link #get$capitalized_name$Map()} instead.\n"
                   " */\n"
                   "@java.lang.Override\n"
                   "@java.lang.Deprecated\n"
                   "public java.util.Map<$type_parameters$> "
                   "${$get$capitalized_name$$}$() {\n"
                   "  return get$capitalized_name$Map();\n"
                   "}\n");
    printer->Annotate("{", "}", descriptor_);
  }
  WriteFieldDocComment(printer, descriptor_, context_->options());
  printer->Print(variables_,
                 "@java.lang.Override\n"
                 "$deprecation$public java.util.Map<$type_parameters$> "
                 "${$get$capitalized_name$Map$}$() {\n"
                 "  return internalGet$capitalized_name$().getImmutableMap();\n"
                 "}\n");
  printer->Annotate("{", "}", descriptor_);
  WriteFieldDocComment(printer, descriptor_, context_->options());
  printer->Print(
      variables_,
      "@java.lang.Override\n"
      "$deprecation$public $value_type_pass_through_nullness$ "
      "${$get$capitalized_name$OrDefault$}$(\n"
      "    $key_type$ key,\n"
      "    $value_type_pass_through_nullness$ defaultValue) {\n"
      "  $key_null_check$\n"
      "  java.util.Map<$boxed_key_type$, $value_interface_type$> map = "
      "internalGetMutable$capitalized_name$().ensureBuilderMap();\n"
      "  return map.containsKey(key) ? $name$Converter.build(map.get(key)) : "
      "defaultValue;\n"
      "}\n");
  printer->Annotate("{", "}", descriptor_);
  WriteFieldDocComment(printer, descriptor_, context_->options());
  printer->Print(
      variables_,
      "@java.lang.Override\n"
      "$deprecation$public $value_type$ ${$get$capitalized_name$OrThrow$}$(\n"
      "    $key_type$ key) {\n"
      "  $key_null_check$\n"
      "  java.util.Map<$boxed_key_type$, $value_interface_type$> map = "
      "internalGetMutable$capitalized_name$().ensureBuilderMap();\n"
      "  if (!map.containsKey(key)) {\n"
      "    throw new java.lang.IllegalArgumentException();\n"
      "  }\n"
      "  return $name$Converter.build(map.get(key));\n"
      "}\n");
  printer->Annotate("{", "}", descriptor_);
}